

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void idct32_high16_stage4_avx2(__m256i *x,int32_t *cospi,__m256i _r,int8_t cos_bit)

{
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  int32_t cos_bit_00;
  int32_t cos_bit_01;
  int32_t cos_bit_02;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  longlong in_register_00001218;
  undefined1 in_stack_00000028 [32];
  undefined1 in_stack_00000048 [32];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  
  uVar2 = 0x31ff04f;
  uVar1 = 0xd4ef71c;
  w0[1] = in_XMM0_Qb;
  w0[0] = in_XMM0_Qa;
  w0[2] = in_YMM0_H;
  w0[3] = in_register_00001218;
  w1[1]._0_4_ = 0xd4ef71c;
  w1[0] = 0xd4ef71c0d4ef71c;
  w1[1]._4_4_ = 0xd4ef71c;
  w1[2]._0_4_ = 0xd4ef71c;
  w1[2]._4_4_ = 0xd4ef71c;
  w1[3]._0_4_ = 0xd4ef71c;
  w1[3]._4_4_ = 0xd4ef71c;
  _r_00[1]._0_4_ = 0x31ff04f;
  _r_00[0] = 0x31ff04f031ff04f;
  _r_00[1]._4_4_ = 0x31ff04f;
  _r_00[2]._0_4_ = 0x31ff04f;
  _r_00[2]._4_4_ = 0x31ff04f;
  _r_00[3]._0_4_ = 0x31ff04f;
  _r_00[3]._4_4_ = 0x31ff04f;
  uVar3 = uVar1;
  uVar4 = uVar1;
  uVar5 = uVar1;
  uVar6 = uVar1;
  uVar7 = uVar1;
  uVar8 = uVar1;
  uVar9 = uVar1;
  uVar10 = uVar2;
  uVar11 = uVar2;
  uVar12 = uVar2;
  uVar13 = uVar2;
  uVar14 = uVar2;
  uVar15 = uVar2;
  uVar16 = uVar2;
  btf_16_w16_avx2(w0,w1,x + 0x11,x + 0x1e,_r_00,0x8e40000);
  w0_00[1] = in_XMM0_Qb;
  w0_00[0] = in_XMM0_Qa;
  w0_00[2] = in_YMM0_H;
  w0_00[3] = in_register_00001218;
  w1_00[0]._4_4_ = uVar3;
  w1_00[0]._0_4_ = uVar1;
  w1_00[1]._0_4_ = uVar4;
  w1_00[1]._4_4_ = uVar5;
  w1_00[2]._0_4_ = uVar6;
  w1_00[2]._4_4_ = uVar7;
  w1_00[3]._0_4_ = uVar8;
  w1_00[3]._4_4_ = uVar9;
  _r_01[0]._4_4_ = uVar10;
  _r_01[0]._0_4_ = uVar2;
  _r_01[1]._0_4_ = uVar11;
  _r_01[1]._4_4_ = uVar12;
  _r_01[2]._0_4_ = uVar13;
  _r_01[2]._4_4_ = uVar14;
  _r_01[3]._0_4_ = uVar15;
  _r_01[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_00,w1_00,x + 0x12,x + 0x1d,_r_01,cos_bit_00);
  w0_01[1] = in_XMM0_Qb;
  w0_01[0] = in_XMM0_Qa;
  w0_01[2] = in_YMM0_H;
  w0_01[3] = in_register_00001218;
  w1_01[0]._4_4_ = uVar3;
  w1_01[0]._0_4_ = uVar1;
  w1_01[1]._0_4_ = uVar4;
  w1_01[1]._4_4_ = uVar5;
  w1_01[2]._0_4_ = uVar6;
  w1_01[2]._4_4_ = uVar7;
  w1_01[3]._0_4_ = uVar8;
  w1_01[3]._4_4_ = uVar9;
  _r_02[0]._4_4_ = uVar10;
  _r_02[0]._0_4_ = uVar2;
  _r_02[1]._0_4_ = uVar11;
  _r_02[1]._4_4_ = uVar12;
  _r_02[2]._0_4_ = uVar13;
  _r_02[2]._4_4_ = uVar14;
  _r_02[3]._0_4_ = uVar15;
  _r_02[3]._4_4_ = uVar16;
  btf_16_w16_avx2(w0_01,w1_01,x + 0x15,x + 0x1a,_r_02,cos_bit_01);
  btf_16_w16_avx2(_r,(__m256i)in_stack_00000028,x + 0x16,x + 0x19,(__m256i)in_stack_00000048,
                  cos_bit_02);
  return;
}

Assistant:

static inline void idct32_high16_stage4_avx2(__m256i *x, const int32_t *cospi,
                                             const __m256i _r, int8_t cos_bit) {
  const __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  const __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  const __m256i cospi_m56_m08 = pair_set_w16_epi16(-cospi[56], -cospi[8]);
  const __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  const __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  const __m256i cospi_m24_m40 = pair_set_w16_epi16(-cospi[24], -cospi[40]);
  btf_16_w16_avx2(cospi_m08_p56, cospi_p56_p08, &x[17], &x[30], _r, cos_bit);
  btf_16_w16_avx2(cospi_m56_m08, cospi_m08_p56, &x[18], &x[29], _r, cos_bit);
  btf_16_w16_avx2(cospi_m40_p24, cospi_p24_p40, &x[21], &x[26], _r, cos_bit);
  btf_16_w16_avx2(cospi_m24_m40, cospi_m40_p24, &x[22], &x[25], _r, cos_bit);
}